

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# take_at_most.hpp
# Opt level: O2

iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
* __thiscall
burst::detail::
take_at_most_impl<std::istream_iterator<int,char,std::char_traits<char>,long>,long,std::input_iterator_tag>
          (iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
           *__return_storage_ptr__,detail *this,undefined8 *first,
          take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
          *last)

{
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
  local_58;
  undefined8 local_30;
  undefined4 local_28;
  detail local_24;
  undefined8 local_20;
  undefined4 local_18;
  undefined1 local_14;
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
  *local_10;
  
  local_30 = *(undefined8 *)this;
  local_28 = *(undefined4 *)(this + 8);
  local_24 = this[0xc];
  local_20 = *first;
  local_18 = *(undefined4 *)(first + 1);
  local_14 = *(undefined1 *)((long)first + 0xc);
  local_58.m_begin._M_stream = (istream_type *)0x0;
  local_58.m_begin._M_value = 0;
  local_58.m_begin._M_ok = false;
  local_58.m_end._M_stream = (istream_type *)0x0;
  local_58.m_end._M_value = 0;
  local_58.m_end._M_ok = false;
  local_58.m_remaining = 0;
  local_10 = last;
  boost::
  make_iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>>
            (__return_storage_ptr__,(boost *)&local_30,&local_58,last);
  return __return_storage_ptr__;
}

Assistant:

auto take_at_most_impl (Iterator first, Iterator last, Integer n, Category)
        {
            auto begin = burst::make_take_at_most_iterator(first, last, n);
            auto end = burst::make_take_at_most_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }